

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::anon_unknown_3::SymbolProperties::GetFileName
          (string *__return_storage_ptr__,SymbolProperties *this,string *path)

{
  long lVar1;
  size_t at;
  string *path_local;
  SymbolProperties *this_local;
  string *file;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  if ((this->ReportPath == 0) &&
     (lVar1 = std::__cxx11::string::rfind((char)__return_storage_ptr__,0x2f), lVar1 != -1)) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SymbolProperties::GetFileName(const std::string& path) const
{
  std::string file(path);
  if (!this->ReportPath) {
    size_t at = file.rfind('/');
    if (at != std::string::npos) {
      file.erase(0, at + 1);
    }
  }
  return file;
}